

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setGeometry(ToolBarLayout *this,QRect *rect)

{
  QWidgetItem *pQVar1;
  QLayoutItem *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Int IVar8;
  const_reference ppQVar9;
  long lVar10;
  qsizetype qVar11;
  bool bVar12;
  int local_258;
  int local_1a0;
  int local_174;
  QRect local_118;
  QRect local_108;
  QRect local_f8;
  QRect local_e8;
  QRect local_d8;
  byte local_c5;
  undefined1 local_c4 [7];
  bool rightArrowShown;
  Int local_b4;
  Int local_b0;
  Int local_ac;
  int local_a8;
  int local_a4;
  int space;
  int stop;
  int local_90;
  int local_8c;
  int tmpOffset;
  int i;
  int dim;
  QSize buttonSize;
  QRect local_74;
  QRect local_64;
  byte local_51;
  QSize QStack_50;
  bool leftArrowShown;
  QSize rightSize;
  QSize leftSize;
  int y;
  int x;
  QRect r;
  QMargins m;
  QRect *rect_local;
  ToolBarLayout *this_local;
  
  QLayout::setGeometry((QRect *)this);
  r._8_8_ = QLayout::contentsMargins();
  iVar4 = QMargins::left((QMargins *)&r.x2);
  iVar5 = QMargins::top((QMargins *)&r.x2);
  iVar6 = QMargins::right((QMargins *)&r.x2);
  iVar7 = QMargins::bottom((QMargins *)&r.x2);
  _y = QRect::adjusted(rect,iVar4,iVar5,-iVar6,-iVar7);
  leftSize.ht = QRect::x((QRect *)&y);
  leftSize.wd = QRect::y((QRect *)&y);
  bVar3 = QList<QLayoutItem_*>::isEmpty(&this->buttons);
  if (((!bVar3) && (this->left != (QWidgetItem *)0x0)) && (this->right != (QWidgetItem *)0x0)) {
    if (this->offset < 0) {
      this->offset = 0;
    }
    rightSize = (QSize)(**(code **)(*(long *)this->left + 0x10))();
    QStack_50 = (QSize)(**(code **)(*(long *)this->right + 0x10))();
    if (this->orient == Horizontal) {
      iVar4 = QRect::y((QRect *)&y);
      iVar5 = QRect::height((QRect *)&y);
      iVar6 = QSize::height(&rightSize);
      leftSize.wd = iVar4 + (iVar5 - iVar6) / 2;
    }
    else {
      iVar4 = QRect::x((QRect *)&y);
      iVar5 = QRect::width((QRect *)&y);
      iVar6 = QSize::width(&rightSize);
      leftSize.ht = iVar4 + (iVar5 - iVar6) / 2;
    }
    local_51 = 0;
    if (this->offset < 1) {
      pQVar1 = this->left;
      QRect::QRect(&local_74,0,0,0,0);
      (**(code **)(*(long *)pQVar1 + 0x30))(pQVar1,&local_74);
      QSize::QSize(&buttonSize,0,0);
      rightSize = buttonSize;
      leftSize.ht = QRect::x((QRect *)&y);
      leftSize.wd = QRect::y((QRect *)&y);
    }
    else {
      local_51 = 1;
      pQVar1 = this->left;
      iVar4 = QSize::width(&rightSize);
      iVar5 = QSize::height(&rightSize);
      QRect::QRect(&local_64,leftSize.ht,leftSize.wd,iVar4,iVar5);
      (**(code **)(*(long *)pQVar1 + 0x30))(pQVar1,&local_64);
      if (this->orient == Horizontal) {
        iVar4 = QSize::width(&rightSize);
        iVar5 = (**(code **)(*(long *)this + 0x60))();
        leftSize.ht = iVar4 + iVar5 + leftSize.ht;
      }
      else {
        iVar4 = QSize::height(&rightSize);
        iVar5 = (**(code **)(*(long *)this + 0x60))();
        leftSize.wd = iVar4 + iVar5 + leftSize.wd;
      }
    }
    ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,0);
    _i = (QSize)(**(code **)(*(long *)*ppQVar9 + 0x10))();
    if (this->orient == Horizontal) {
      local_174 = QSize::width((QSize *)&i);
    }
    else {
      local_174 = QSize::height((QSize *)&i);
    }
    iVar4 = (**(code **)(*(long *)this + 0x60))();
    tmpOffset = local_174 + iVar4;
    local_8c = 0;
    for (local_90 = this->offset; tmpOffset <= local_90; local_90 = local_90 - tmpOffset) {
      ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,(long)local_8c);
      pQVar2 = *ppQVar9;
      QRect::QRect((QRect *)&space,0,0,0,0);
      (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&space);
      local_8c = local_8c + 1;
    }
    local_a4 = 0;
    if (this->orient == Horizontal) {
      leftSize.ht = this->offset % tmpOffset + leftSize.ht;
      local_90 = leftSize.ht;
      iVar4 = QRect::width((QRect *)&y);
      iVar5 = QSize::width(&rightSize);
      local_a4 = ((iVar4 - iVar5) / tmpOffset) * tmpOffset;
      iVar4 = QRect::y((QRect *)&y);
      iVar5 = QRect::height((QRect *)&y);
      iVar6 = QSize::height((QSize *)&i);
      leftSize.wd = iVar4 + (iVar5 - iVar6) / 2;
    }
    else {
      leftSize.wd = this->offset % tmpOffset + leftSize.wd;
      local_90 = leftSize.wd;
      iVar4 = QRect::height((QRect *)&y);
      iVar5 = QSize::height(&rightSize);
      local_a4 = ((iVar4 - iVar5) / tmpOffset) * tmpOffset;
      iVar4 = QRect::x((QRect *)&y);
      iVar5 = QRect::width((QRect *)&y);
      iVar6 = QSize::width((QSize *)&i);
      leftSize.ht = iVar4 + (iVar5 - iVar6) / 2;
    }
    iVar4 = spaceNeeded(this);
    local_a8 = iVar4;
    if (this->orient == Horizontal) {
      local_1a0 = QRect::width((QRect *)&y);
    }
    else {
      local_1a0 = QRect::height((QRect *)&y);
    }
    if (iVar4 < local_1a0) {
      local_ac = (Int)QFlags<Qt::AlignmentFlag>::operator&(&this->align,AlignRight);
      IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ac);
      bVar3 = false;
      if (IVar8 != 0) {
        bVar3 = this->orient == Horizontal;
      }
      local_b0 = (Int)QFlags<Qt::AlignmentFlag>::operator&(&this->align,AlignBottom);
      IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b0);
      bVar12 = false;
      if (IVar8 != 0) {
        bVar12 = this->orient == Vertical;
      }
      if (bVar3 || bVar12) {
        if (this->orient == Horizontal) {
          iVar4 = QRect::width((QRect *)&y);
          leftSize.ht = (iVar4 - local_a8) + leftSize.ht;
        }
        else {
          iVar4 = QRect::height((QRect *)&y);
          leftSize.wd = (iVar4 - local_a8) + leftSize.wd;
        }
      }
      else {
        local_b4 = (Int)QFlags<Qt::AlignmentFlag>::operator&(&this->align,AlignCenter);
        IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b4);
        if (IVar8 != 0) {
          if (this->orient == Horizontal) {
            iVar4 = QRect::width((QRect *)&y);
            leftSize.ht = (iVar4 - local_a8) / 2 + leftSize.ht;
          }
          else {
            iVar4 = QRect::height((QRect *)&y);
            leftSize.wd = (iVar4 - local_a8) / 2 + leftSize.wd;
          }
        }
      }
    }
    local_a8 = 0;
    while( true ) {
      bVar3 = false;
      if (local_90 < local_a4) {
        lVar10 = (long)local_8c;
        qVar11 = QList<QLayoutItem_*>::size(&this->buttons);
        bVar3 = lVar10 < qVar11;
      }
      if (!bVar3) break;
      ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,(long)local_8c);
      pQVar2 = *ppQVar9;
      iVar4 = QSize::width((QSize *)&i);
      iVar5 = QSize::height((QSize *)&i);
      QRect::QRect((QRect *)local_c4,leftSize.ht,leftSize.wd,iVar4,iVar5);
      (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,local_c4);
      if (this->orient == Horizontal) {
        local_a8 = tmpOffset + leftSize.ht;
        leftSize.ht = local_a8;
      }
      else {
        local_a8 = tmpOffset + leftSize.wd;
        leftSize.wd = local_a8;
      }
      local_90 = tmpOffset + local_90;
      local_8c = local_8c + 1;
    }
    local_c5 = 0;
    lVar10 = (long)local_8c;
    qVar11 = QList<QLayoutItem_*>::size(&this->buttons);
    if (lVar10 < qVar11) {
      if (this->orient == Horizontal) {
        iVar4 = QRect::width((QRect *)&y);
        iVar5 = QSize::width(&stack0xffffffffffffffb0);
        iVar6 = QRect::x((QRect *)&y);
        leftSize.ht = (iVar4 - iVar5) + iVar6;
        iVar5 = QRect::y((QRect *)&y);
        iVar6 = QRect::height((QRect *)&y);
        iVar7 = QSize::height(&stack0xffffffffffffffb0);
        iVar4 = local_90;
        leftSize.wd = iVar5 + (iVar6 - iVar7) / 2;
        iVar5 = QRect::width((QRect *)&y);
        if (iVar5 < iVar4) {
          ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,(long)(local_8c + -1));
          pQVar2 = *ppQVar9;
          QRect::QRect(&local_d8,0,0,0,0);
          (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_d8);
        }
      }
      else {
        iVar4 = QRect::x((QRect *)&y);
        iVar5 = QRect::width((QRect *)&y);
        iVar6 = QSize::width(&stack0xffffffffffffffb0);
        leftSize.ht = iVar4 + (iVar5 - iVar6) / 2;
        iVar5 = QRect::height((QRect *)&y);
        iVar6 = QSize::height(&stack0xffffffffffffffb0);
        iVar7 = QRect::y((QRect *)&y);
        iVar4 = local_90;
        leftSize.wd = (iVar5 - iVar6) + iVar7;
        iVar5 = QRect::height((QRect *)&y);
        if (iVar5 < iVar4) {
          ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,(long)(local_8c + -1));
          pQVar2 = *ppQVar9;
          QRect::QRect(&local_e8,0,0,0,0);
          (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_e8);
        }
      }
      pQVar1 = this->right;
      iVar4 = QSize::width(&stack0xffffffffffffffb0);
      iVar5 = QSize::height(&stack0xffffffffffffffb0);
      QRect::QRect(&local_f8,leftSize.ht,leftSize.wd,iVar4,iVar5);
      (**(code **)(*(long *)pQVar1 + 0x30))(pQVar1,&local_f8);
      (**(code **)(*(long *)this->right + 0x68))();
      QWidget::raise();
      local_c5 = 1;
    }
    else {
      pQVar1 = this->right;
      QRect::QRect(&local_108,0,0,0,0);
      (**(code **)(*(long *)pQVar1 + 0x30))(pQVar1,&local_108);
    }
    lVar10 = (long)local_8c;
    qVar11 = QList<QLayoutItem_*>::size(&this->buttons);
    if (lVar10 < qVar11) {
      for (; lVar10 = (long)local_8c, qVar11 = QList<QLayoutItem_*>::size(&this->buttons),
          lVar10 < qVar11; local_8c = local_8c + 1) {
        ppQVar9 = QList<QLayoutItem_*>::at(&this->buttons,(long)local_8c);
        pQVar2 = *ppQVar9;
        QRect::QRect(&local_118,0,0,0,0);
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_118);
      }
    }
    else if (((0 < this->offset) && ((local_51 & 1) != 0)) && ((local_c5 & 1) == 0)) {
      iVar4 = local_a8 + tmpOffset / 2;
      if (this->orient == Horizontal) {
        local_258 = QRect::width((QRect *)&y);
      }
      else {
        local_258 = QRect::height((QRect *)&y);
      }
      if (iVar4 <= local_258) {
        this->offset = 0;
        (**(code **)(*(long *)this + 0xa0))(this,rect);
      }
    }
    (**(code **)(*(long *)this->left + 0x68))();
    QWidget::raise();
  }
  return;
}

Assistant:

void
ToolBarLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int x = r.x();
	int y = r.y();

	if( !buttons.isEmpty() && left && right )
	{
		if( offset < 0 )
			offset = 0;

		QSize leftSize = left->sizeHint();
		const QSize rightSize = right->sizeHint();

		if( orient == Qt::Horizontal )
			y = r.y() + ( r.height() - leftSize.height() ) / 2;
		else
			x = r.x() + ( r.width() - leftSize.width() ) / 2;

		// Set left arrow geometry.
		bool leftArrowShown = false;

		if( offset > 0 )
		{
			leftArrowShown = true;

			left->setGeometry( QRect( x, y, leftSize.width(), leftSize.height() ) );

			if( orient == Qt::Horizontal )
				x += leftSize.width() + spacing();
			else
				y += leftSize.height() + spacing();
		}
		else
		{
			left->setGeometry( QRect( 0, 0, 0, 0 ) );
			leftSize = QSize( 0, 0 );

			x = r.x();
			y = r.y();
		}

		const QSize buttonSize = buttons.at( 0 )->sizeHint();
		const int dim = ( orient == Qt::Horizontal ?
			buttonSize.width() : buttonSize.height() ) + spacing();
		int i = 0;
		int tmpOffset = offset;

		// Hide buttons that left on left arrow.
		while( tmpOffset >= dim )
		{
			buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );

			++i;
			tmpOffset -= dim;
		}

		int stop = 0;

		// Show visible buttons.
		if( orient == Qt::Horizontal )
		{
			x += offset % dim;
			tmpOffset = x;
			stop = ( r.width() - leftSize.width() ) / dim * dim;
			y = r.y() + ( r.height() - buttonSize.height() ) / 2;
		}
		else
		{
			y += offset % dim;
			tmpOffset = y;
			stop = ( r.height() - leftSize.height() ) / dim * dim;
			x = r.x() + ( r.width() - buttonSize.width() ) / 2;
		}

		int space = spaceNeeded();

		if( space < ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			if( ( ( align & Qt::AlignRight ) && orient == Qt::Horizontal )
				| ( ( align & Qt::AlignBottom ) && orient == Qt::Vertical  ) )
			{
				if( orient == Qt::Horizontal )
					x += r.width() - space;
				else
					y += r.height() - space;
			}
			else if( align & Qt::AlignCenter )
			{
				if( orient == Qt::Horizontal )
					x += ( r.width() - space ) / 2;
				else
					y += ( r.height() - space ) / 2;
			}
		}

		space = 0;

		while( tmpOffset < stop && i < buttons.size() )
		{
			buttons.at( i )->setGeometry( QRect( x, y,
				buttonSize.width(), buttonSize.height() ) );

			if( orient == Qt::Horizontal )
			{
				x += dim;
				space = x;
			}
			else
			{
				y += dim;
				space = y;
			}

			tmpOffset += dim;
			++i;
		}

		// Set right arrow geometry.
		bool rightArrowShown = false;

		if( i < buttons.size() )
		{
			if( orient == Qt::Horizontal )
			{
				x = r.width() - rightSize.width() + r.x();
				y = r.y() + ( r.height() - rightSize.height() ) / 2;

				if( tmpOffset > r.width() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}
			else
			{
				x = r.x() + ( r.width() - rightSize.width() ) / 2;
				y = r.height() - rightSize.height() + r.y();

				if( tmpOffset > r.height() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}

			right->setGeometry( QRect( x, y,
				rightSize.width(), rightSize.height() ) );

			right->widget()->raise();

			rightArrowShown = true;
		}
		else
		{
			right->setGeometry( QRect( 0, 0, 0, 0 ) );
		}

		// Hide buttons that right on right arrow.
		if( i < buttons.size() )
		{
			for( ; i < buttons.size(); ++i )
				buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );
		}
		else if( offset > 0 && leftArrowShown &&
			!rightArrowShown &&
			space + dim / 2 <= ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			offset = 0;
			setGeometry( rect );
		}

		left->widget()->raise();
	}
}